

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx86_64-ABI-code.c
# Opt level: O3

int classify_arg(c2m_ctx_t c2m_ctx,type *type,MIR_type_t *types,int bit_field_p)

{
  type_mode tVar1;
  void *pvVar2;
  long lVar3;
  type *type_00;
  MIR_type_t *pMVar4;
  int iVar5;
  uint uVar6;
  MIR_type_t MVar7;
  MIR_type_t MVar8;
  int iVar9;
  mir_size_t mVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  node_t pnVar14;
  ulong uVar15;
  ulong uVar16;
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  MIR_type_t subtypes [2];
  MIR_type_t local_50 [2];
  ulong local_48;
  MIR_type_t *local_40;
  ulong local_38;
  
  mVar10 = raw_type_size(c2m_ctx,type);
  uVar11 = (ulong)type->align;
  if (uVar11 != 0) {
    uVar16 = (mVar10 - 1) + uVar11;
    mVar10 = uVar16 - uVar16 % uVar11;
  }
  tVar1 = type->mode;
  if (tVar1 - TM_STRUCT < 3) {
    uVar11 = mVar10 + 7;
    iVar5 = 0;
    if (uVar11 < 0x18) {
      uVar16 = uVar11 >> 3;
      iVar5 = (int)uVar16;
      if (7 < uVar11) {
        auVar17 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar18 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        auVar19 = vpbroadcastd_avx512f(ZEXT416(0x14));
        auVar20 = vpbroadcastq_avx512f();
        uVar12 = 0;
        do {
          auVar21 = vpbroadcastq_avx512f();
          auVar22 = vporq_avx512f(auVar21,auVar17);
          auVar21 = vporq_avx512f(auVar21,auVar18);
          vpcmpuq_avx512f(auVar21,auVar20,2);
          vpcmpuq_avx512f(auVar22,auVar20,2);
          auVar21 = vmovdqu32_avx512f(auVar19);
          *(undefined1 (*) [64])(types + uVar12) = auVar21;
          uVar12 = uVar12 + 0x10;
        } while ((iVar5 + 0xfU & 0x10) != uVar12);
        tVar1 = type->mode;
      }
      if (tVar1 - TM_STRUCT < 2) {
        pnVar14 = (((((((type->u).tag_type)->u).ops.head)->op_link).next)->u).ops.head;
        local_48 = uVar11;
        if (pnVar14 != (node_t)0x0) {
          local_40 = types + 1;
          do {
            if (pnVar14->code == N_MEMBER) {
              pvVar2 = pnVar14->attr;
              uVar11 = *(ulong *)((long)pvVar2 + 0x10);
              if (*(long *)((long)pvVar2 + 0x48) != 0) {
                lVar3 = *(long *)(*(long *)((long)pvVar2 + 0x48) + 8);
                if ((*(uint *)(*(long *)(lVar3 + 0x40) + 0x18) & 0xfffffffe) != 4) {
                  __assert_fail("decl2->decl_spec.type->mode == TM_STRUCT || decl2->decl_spec.type->mode == TM_UNION"
                                ,
                                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/x86_64/cx86_64-ABI-code.c"
                                ,0x45,
                                "int classify_arg(c2m_ctx_t, struct type *, MIR_type_t *, int)");
                }
                uVar11 = uVar11 - *(long *)(lVar3 + 0x10);
              }
              type_00 = *(type **)((long)pvVar2 + 0x40);
              mVar10 = raw_type_size(c2m_ctx,type_00);
              uVar12 = (ulong)type_00->align;
              if (uVar12 != 0) {
                uVar15 = (mVar10 - 1) + uVar12;
                mVar10 = uVar15 - uVar15 % uVar12;
              }
              iVar9 = (int)(uVar11 >> 3);
              if (*(int *)((long)pvVar2 + 4) < 0) {
                uVar6 = classify_arg(c2m_ctx,*(type **)((long)pvVar2 + 0x40),local_50,(int)mVar10);
                pMVar4 = local_40;
                if (uVar6 == 0) {
                  return 0;
                }
                if (0 < (int)uVar6) {
                  uVar12 = (ulong)iVar9;
                  uVar15 = uVar16 - uVar12;
                  if (uVar16 < uVar12) {
                    uVar15 = 0;
                  }
                  uVar13 = 0;
                  local_38 = (ulong)uVar6;
                  do {
                    if (uVar15 == uVar13) break;
                    MVar8 = local_50[uVar13];
                    MVar7 = get_result_type(MVar8,pMVar4[uVar12 + (uVar13 - 1)]);
                    pMVar4[uVar12 + (uVar13 - 1)] = MVar7;
                    if ((int)uVar6 <= (int)((uVar11 - 1) + mVar10 >> 3) - iVar9) {
                      MVar8 = get_result_type(MVar8,pMVar4[uVar12 + uVar13]);
                      pMVar4[uVar12 + uVar13] = MVar8;
                    }
                    uVar13 = uVar13 + 1;
                  } while (local_38 != uVar13);
                }
              }
              else {
                MVar8 = types[iVar9];
                if (MVar8 != MIR_T_UNDEF) {
                  MVar8 = MIR_T_I64;
                }
                types[iVar9] = MVar8;
              }
            }
            pnVar14 = (pnVar14->op_link).next;
          } while (pnVar14 != (node_t)0x0);
        }
      }
      else {
        if (tVar1 != TM_ARR) {
          __assert_fail("FALSE",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/x86_64/cx86_64-ABI-code.c"
                        ,0x5b,"int classify_arg(c2m_ctx_t, struct type *, MIR_type_t *, int)");
        }
        iVar9 = classify_arg(c2m_ctx,((type->u).ptr_type)->arr_type,local_50,6);
        if (iVar9 == 0) {
          return 0;
        }
        if (uVar11 < 8) {
          return iVar5;
        }
        uVar12 = 0;
        local_48 = uVar11;
        do {
          MVar8 = get_result_type(types[uVar12],
                                  local_50[(long)((ulong)(uint)((int)uVar12 >> 0x1f) << 0x20 |
                                                 uVar12 & 0xffffffff) % (long)iVar9 & 0xffffffff]);
          types[uVar12] = MVar8;
          uVar12 = uVar12 + 1;
        } while (uVar16 != uVar12);
      }
      if (7 < local_48) {
        uVar11 = 0;
        do {
          if (types[uVar11] == 0x15) {
            if (uVar11 == 0) {
              return 0;
            }
            if (types[uVar11 - 1] != MIR_T_LD) {
              return 0;
            }
          }
          else if (types[uVar11] == MIR_T_UNDEF) {
            return 0;
          }
          uVar11 = uVar11 + 1;
        } while (uVar16 != uVar11);
      }
    }
  }
  else {
    if ((1 < tVar1 - TM_ENUM) && ((tVar1 != TM_BASIC || (0xe < (type->u).basic_type - TP_BOOL)))) {
      __assert_fail("scalar_type_p (type)",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/x86_64/cx86_64-ABI-code.c"
                    ,0x6c,"int classify_arg(c2m_ctx_t, struct type *, MIR_type_t *, int)");
    }
    MVar8 = get_mir_type(c2m_ctx,type);
    if (MVar8 - MIR_T_F < 2) {
      *types = MIR_T_D;
    }
    else {
      if (MVar8 == MIR_T_LD) {
        types[0] = MIR_T_LD;
        types[1] = 0x15;
        return 2;
      }
      *types = MIR_T_I64;
    }
    iVar5 = 1;
  }
  return iVar5;
}

Assistant:

static int classify_arg (c2m_ctx_t c2m_ctx, struct type *type, MIR_type_t types[MAX_QWORDS],
                         int bit_field_p MIR_UNUSED) {
  size_t size = type_size (c2m_ctx, type), n_qwords = (size + 7) / 8;
  MIR_type_t mir_type;

  if (type->mode == TM_STRUCT || type->mode == TM_UNION || type->mode == TM_ARR) {
    if (n_qwords > MAX_QWORDS) return 0; /* too big aggregate */

#ifndef _WIN32
    MIR_type_t subtypes[MAX_QWORDS];
    int i, n_el_qwords;
    for (i = 0; (size_t) i < n_qwords; i++) types[i] = (MIR_type_t) NO_CLASS;

    switch (type->mode) {
    case TM_ARR: { /* Arrays are handled as small records.  */
      n_el_qwords = classify_arg (c2m_ctx, type->u.arr_type->el_type, subtypes, FALSE);
      if (n_el_qwords == 0) return 0;
      /* make full types: */
      for (i = 0; (size_t) i < n_qwords; i++)
        types[i] = get_result_type (types[i], subtypes[i % n_el_qwords]);
      break;
    }
    case TM_STRUCT:
    case TM_UNION:
      for (node_t el = NL_HEAD (NL_EL (type->u.tag_type->u.ops, 1)->u.ops); el != NULL;
           el = NL_NEXT (el))
        if (el->code == N_MEMBER) {
          decl_t decl = el->attr;
          mir_size_t offset = decl->offset;
          node_t container;
          if ((container = decl->containing_unnamed_anon_struct_union_member) != NULL) {
            decl_t decl2 = container->attr;
            assert (decl2->decl_spec.type->mode == TM_STRUCT
                    || decl2->decl_spec.type->mode == TM_UNION);
            offset -= decl2->offset;
          }
          int start_qword = offset / 8;
          int end_qword = (offset + type_size (c2m_ctx, decl->decl_spec.type) - 1) / 8;
          int span_qwords = end_qword - start_qword + 1;

          if (decl->bit_offset >= 0) {
            types[start_qword] = get_result_type (MIR_T_I64, types[start_qword]);
          } else {
            n_el_qwords
              = classify_arg (c2m_ctx, decl->decl_spec.type, subtypes, decl->bit_offset >= 0);
            if (n_el_qwords == 0) return 0;
            for (i = 0; i < n_el_qwords && (size_t) (i + start_qword) < n_qwords; i++) {
              types[i + start_qword] = get_result_type (subtypes[i], types[i + start_qword]);
              if (span_qwords > n_el_qwords)
                types[i + start_qword + 1]
                  = get_result_type (subtypes[i], types[i + start_qword + 1]);
            }
          }
        }
      break;
    default: assert (FALSE);
    }

    if (n_qwords > 2) return 0; /* as we don't have vector values (see SSEUP_CLASS) */

    for (i = 0; (size_t) i < n_qwords; i++) {
      if (types[i] == MIR_T_UNDEF) return 0; /* pass in memory if a word class is memory.  */
      if ((enum add_arg_class) types[i] == X87UP_CLASS && (i == 0 || types[i - 1] != MIR_T_LD))
        return 0;
    }
    return n_qwords;
#else
    types[0] = MIR_T_I64;
    return 1;
#endif
  }

  assert (scalar_type_p (type));
  switch (mir_type = get_mir_type (c2m_ctx, type)) {
  case MIR_T_F:
  case MIR_T_D: types[0] = MIR_T_D; return 1;
  case MIR_T_LD:
    types[0] = MIR_T_LD;
    types[1] = (MIR_type_t) X87UP_CLASS;
    return 2;
  default: types[0] = MIR_T_I64; return 1;
  }
}